

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  undefined1 uVar5;
  char *in_end;
  long lVar6;
  char *in_start;
  StringRef *component;
  StringRef *this;
  bool bVar7;
  StringRef Chars;
  SmallVector<llvm::StringRef,_4U> components;
  SmallString<32U> d_storage;
  SmallString<32U> c_storage;
  SmallString<32U> b_storage;
  SmallString<32U> a_storage;
  StringRef local_160;
  char *local_148;
  SmallVectorTemplateBase<llvm::StringRef,_true> local_140;
  StringRef local_130 [4];
  SmallVectorImpl<char> local_f0;
  undefined1 local_e0 [32];
  SmallVectorImpl<char> local_c0;
  undefined1 local_b0 [32];
  SmallVectorImpl<char> local_90;
  undefined1 local_80 [32];
  SmallVectorImpl<char> local_60;
  undefined1 local_50 [32];
  
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_50;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_90.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_80;
  local_90.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_90.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_b0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_f0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_e0;
  local_f0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_f0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       local_130;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity =
       4;
  if (EmptyKind < a->LHSKind) {
    local_160 = Twine::toStringRef(a,&local_60);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back(&local_140,&local_160);
  }
  if (EmptyKind < b->LHSKind) {
    local_160 = Twine::toStringRef(b,&local_90);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back(&local_140,&local_160);
  }
  if (EmptyKind < c->LHSKind) {
    local_160 = Twine::toStringRef(c,&local_c0);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back(&local_140,&local_160);
  }
  if (EmptyKind < d->LHSKind) {
    local_160 = Twine::toStringRef(d,&local_f0);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back(&local_140,&local_160);
  }
  if ((local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
      & 0xffffffff) != 0) {
    bVar7 = style == windows;
    local_148 = "/";
    if (bVar7) {
      local_148 = "\\/";
    }
    uVar5 = 0x2f;
    if (bVar7) {
      uVar5 = 0x5c;
    }
    lVar6 = (local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
             _8_8_ & 0xffffffff) << 4;
    this = (StringRef *)
           local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
           BeginX;
    do {
      uVar3 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if (uVar3 == 0) {
LAB_0014f03b:
        if (((this->Length == 0) ||
            ((*this->Data != '/' && ((style != windows || (*this->Data != '\\')))))) && (uVar3 != 0)
           ) {
          Twine::Twine((Twine *)&local_160,this);
          bVar2 = has_root_name((Twine *)&local_160,style);
          if (!bVar2) {
            local_160.Data._0_1_ = uVar5;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&path->super_SmallVectorTemplateBase<char,_true>,(char *)&local_160);
          }
        }
        in_start = this->Data;
        in_end = in_start + this->Length;
      }
      else {
        cVar1 = *(char *)((long)(path->super_SmallVectorTemplateBase<char,_true>).
                                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                BeginX + (uVar3 - 1));
        if ((cVar1 != '/') && (style != windows || cVar1 != '\\')) goto LAB_0014f03b;
        Chars.Length = (ulong)bVar7 + 1;
        Chars.Data = local_148;
        sVar4 = StringRef::find_first_not_of(this,Chars,0);
        uVar3 = this->Length;
        if (uVar3 < sVar4) {
          sVar4 = uVar3;
        }
        in_start = this->Data + sVar4;
        in_end = this->Data + uVar3;
      }
      SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_end);
      this = this + 1;
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != 0);
  }
  if ((StringRef *)
      local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
      != local_130) {
    free(local_140.super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
         BeginX);
  }
  if ((undefined1 *)
      local_f0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_e0) {
    free(local_f0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_c0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_b0) {
    free(local_c0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_90.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_80) {
    free(local_90.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if ((undefined1 *)
      local_60.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_50) {
    free(local_60.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}